

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O3

void ovf::detail::write::append_data_bin_to_string<double>
               (string *output_to_file,double *vf,int n_cols,int n_rows,int format)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 *local_58;
  string *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_50 = output_to_file;
  if (format == 1) {
    local_58 = (undefined8 *)operator_new(4);
    *(undefined4 *)local_58 = 0x4996b438;
    local_70 = 4;
    local_68 = CONCAT35(local_68._5_3_,0x4996b438);
    local_78 = &local_68;
    std::__cxx11::string::_M_append((char *)local_50,(ulong)&local_68);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(long)(n_cols * 4),(allocator_type *)&local_78);
    if (n_rows != 0) {
      lVar2 = 0;
      iVar3 = 0;
      do {
        local_78 = &local_68;
        if (0 < n_cols) {
          uVar1 = 0;
          do {
            *(float *)(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar1 * 4) =
                 (float)vf[(uint)((int)uVar1 + (int)lVar2)];
            uVar1 = uVar1 + 1;
          } while ((uint)n_cols != uVar1);
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)n_cols * 4);
        std::__cxx11::string::_M_append((char *)local_50,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        iVar3 = iVar3 + 1;
        lVar2 = lVar2 + (ulong)(uint)n_cols;
      } while (iVar3 != n_rows);
    }
  }
  else {
    if (format != 2) goto LAB_00152e67;
    local_58 = (undefined8 *)operator_new(8);
    *local_58 = 0x42dc12218377de40;
    local_68 = 0x42dc12218377de40;
    local_70 = 8;
    local_60 = 0;
    local_78 = &local_68;
    std::__cxx11::string::_M_append((char *)local_50,(ulong)&local_68);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_48,(long)(n_cols * 8),(allocator_type *)&local_78);
    if (n_rows != 0) {
      lVar2 = 0;
      iVar3 = 0;
      do {
        local_78 = &local_68;
        if (0 < n_cols) {
          uVar1 = 0;
          do {
            *(double *)
             (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + uVar1 * 8) = vf[(uint)((int)uVar1 + (int)lVar2)];
            uVar1 = uVar1 + 1;
          } while ((uint)n_cols != uVar1);
        }
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)n_cols * 8);
        std::__cxx11::string::_M_append((char *)local_50,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
        iVar3 = iVar3 + 1;
        lVar2 = lVar2 + (ulong)(uint)n_cols;
      } while (iVar3 != n_rows);
    }
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_58);
LAB_00152e67:
  std::__cxx11::string::append((char *)local_50);
  return;
}

Assistant:

void append_data_bin_to_string( std::string & output_to_file, const T * vf, int n_cols, int n_rows, int format)
    try
    {
        if( format == OVF_FORMAT_BIN8 )
        {
            auto out_check = std::vector<uint8_t>(8);
            endian::to_little_64(check::val_8b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(double) );

            std::vector<uint8_t> out(n_cols*8);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    double val = static_cast<double>(vf[n_cols*i + j]);
                    uint64_t in = *reinterpret_cast<uint64_t*>(&val);

                    endian::to_little_64(in, &out[j*8]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(double) );
            }
        }
        else if( format == OVF_FORMAT_BIN4 )
        {
            auto out_check = std::vector<uint8_t>(4);
            endian::to_little_32(check::val_4b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(float) );

            std::vector<uint8_t> out(n_cols*4);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    float val = static_cast<float>(vf[n_cols*i + j]);
                    uint32_t in = *reinterpret_cast<uint32_t*>(&val);

                    endian::to_little_32(in, &out[j*4]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(float) );
            }
        }

        output_to_file += "\n";
    }
    catch( ... )
    {

    }